

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

Abc_ShaMan_t * Abc_ShaManStart(Abc_Ntk_t *pNtk)

{
  Abc_ShaMan_t *pAVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  
  pAVar1 = (Abc_ShaMan_t *)calloc(1,0x30);
  pAVar1->pNtk = pNtk;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(4000);
  pVVar2->pArray = piVar3;
  pAVar1->vObj2Lit = pVVar2;
  return pAVar1;
}

Assistant:

Abc_ShaMan_t * Abc_ShaManStart( Abc_Ntk_t * pNtk )
{
    Abc_ShaMan_t * p;
    p = ABC_CALLOC( Abc_ShaMan_t, 1 );
    p->pNtk      = pNtk;
    p->vObj2Lit  = Vec_IntAlloc( 1000 );
    return p;
}